

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::SGXMLScanner::laxElementValidation
          (SGXMLScanner *this,QName *element,ContentLeafNameTypeVector *cv,XMLContentModel *cm,
          XMLSize_t parentElemDepth)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  NodeTypes NVar5;
  XMLSize_t XVar6;
  QName *this_00;
  XMLCh *str1;
  XMLCh *str2;
  NodeTypes type;
  NodeTypes type_1;
  uint uri;
  QName *fElemMap;
  uint nextState;
  XMLSize_t leafCount;
  XMLSize_t i;
  SubstitutionGroupComparator comparator;
  uint currLoop;
  uint currState;
  uint elementURI;
  bool laxThisOne;
  bool skipThisOne;
  XMLSize_t parentElemDepth_local;
  XMLContentModel *cm_local;
  ContentLeafNameTypeVector *cv_local;
  QName *element_local;
  SGXMLScanner *this_local;
  
  bVar1 = false;
  currState._2_1_ = false;
  uVar3 = QName::getURI(element);
  comparator.fStringPool._4_4_ = this->fElemState[parentElemDepth];
  comparator.fStringPool._0_4_ = this->fElemLoopState[parentElemDepth];
  if (comparator.fStringPool._4_4_ == 0xffffffff) {
    return false;
  }
  SubstitutionGroupComparator::SubstitutionGroupComparator
            ((SubstitutionGroupComparator *)&i,(this->super_XMLScanner).fGrammarResolver,
             (this->super_XMLScanner).fURIStringPool);
  if (cv != (ContentLeafNameTypeVector *)0x0) {
    leafCount = 0;
    XVar6 = ContentLeafNameTypeVector::getLeafCount(cv);
    fElemMap._0_4_ = 0;
    for (; leafCount < XVar6; leafCount = leafCount + 1) {
      this_00 = ContentLeafNameTypeVector::getLeafNameAt(cv,leafCount);
      uVar4 = QName::getURI(this_00);
      NVar5 = ContentLeafNameTypeVector::getLeafTypeAt(cv,leafCount);
      if (NVar5 == Leaf) {
        if (uVar4 == uVar3) {
          str1 = QName::getLocalPart(this_00);
          str2 = QName::getLocalPart(element);
          bVar2 = XMLString::equals(str1,str2);
          if (!bVar2) goto LAB_0036dc5d;
        }
        else {
LAB_0036dc5d:
          bVar2 = SubstitutionGroupComparator::isEquivalentTo
                            ((SubstitutionGroupComparator *)&i,element,this_00);
          if (!bVar2) goto LAB_0036ddd0;
        }
        fElemMap._0_4_ =
             (*cm->_vptr_XMLContentModel[6])(cm,(ulong)comparator.fStringPool._4_4_,leafCount);
joined_r0x0036ddc2:
        if ((uint)fElemMap != 0xffffffff) break;
      }
      else {
        if ((NVar5 & (Any_NS|Any_Other)) == Any) {
          fElemMap._0_4_ =
               (*cm->_vptr_XMLContentModel[6])(cm,(ulong)comparator.fStringPool._4_4_,leafCount);
          goto joined_r0x0036ddc2;
        }
        if ((NVar5 & (Any_NS|Any_Other)) == Any_Other) {
          if ((uVar4 != uVar3) && (uVar3 != (this->super_XMLScanner).fEmptyNamespaceId)) {
            fElemMap._0_4_ =
                 (*cm->_vptr_XMLContentModel[6])(cm,(ulong)comparator.fStringPool._4_4_,leafCount);
            goto joined_r0x0036ddc2;
          }
        }
        else if (((NVar5 & (Any_NS|Any_Other)) == Any_NS) && (uVar4 == uVar3)) {
          fElemMap._0_4_ =
               (*cm->_vptr_XMLContentModel[6])(cm,(ulong)comparator.fStringPool._4_4_,leafCount);
          goto joined_r0x0036ddc2;
        }
      }
LAB_0036ddd0:
    }
    if (leafCount == XVar6) {
      this->fElemState[parentElemDepth] = 0xffffffff;
      this->fElemLoopState[parentElemDepth] = 0;
      this_local._7_1_ = false;
      goto LAB_0036df29;
    }
    NVar5 = ContentLeafNameTypeVector::getLeafTypeAt(cv,leafCount);
    if ((((NVar5 & (Any_NS|Any_Other)) == Any) || ((NVar5 & (Any_NS|Any_Other)) == Any_Other)) ||
       ((NVar5 & (Any_NS|Any_Other)) == Any_NS)) {
      if (((NVar5 == Any_Skip) || (NVar5 == Any_NS_Skip)) || (NVar5 == Any_Other_Skip)) {
        bVar1 = true;
      }
      else if (((NVar5 == Any_Lax) || (NVar5 == Any_NS_Lax)) || (NVar5 == Any_Other_Lax)) {
        currState._2_1_ = true;
      }
    }
    this->fElemState[parentElemDepth] = (uint)fElemMap;
    this->fElemLoopState[parentElemDepth] = (uint)comparator.fStringPool;
  }
  if (bVar1) {
    (this->super_XMLScanner).fValidate = false;
    ElemStack::setValidationFlag
              (&(this->super_XMLScanner).fElemStack,(bool)((this->super_XMLScanner).fValidate & 1));
  }
  this_local._7_1_ = currState._2_1_;
LAB_0036df29:
  SubstitutionGroupComparator::~SubstitutionGroupComparator((SubstitutionGroupComparator *)&i);
  return this_local._7_1_;
}

Assistant:

bool SGXMLScanner::laxElementValidation(QName* element, ContentLeafNameTypeVector* cv,
                                        const XMLContentModel* const cm,
                                        const XMLSize_t parentElemDepth)
{
    bool skipThisOne = false;
    bool laxThisOne = false;
    unsigned int elementURI = element->getURI();
    unsigned int currState = fElemState[parentElemDepth];
    unsigned int currLoop = fElemLoopState[parentElemDepth];

    if (currState == XMLContentModel::gInvalidTrans) {
        return laxThisOne;
    }

    SubstitutionGroupComparator comparator(fGrammarResolver, fURIStringPool);

    if (cv) {
        XMLSize_t i = 0;
        XMLSize_t leafCount = cv->getLeafCount();
        unsigned int nextState = 0;

        for (; i < leafCount; i++) {

            QName* fElemMap = cv->getLeafNameAt(i);
            unsigned int uri = fElemMap->getURI();
            ContentSpecNode::NodeTypes type = cv->getLeafTypeAt(i);

            if (type == ContentSpecNode::Leaf) {
                if (((uri == elementURI)
                      && XMLString::equals(fElemMap->getLocalPart(), element->getLocalPart()))
                    || comparator.isEquivalentTo(element, fElemMap)) {

                    nextState = cm->getNextState(currState, i);

                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            } else if ((type & 0x0f) == ContentSpecNode::Any) {
                nextState = cm->getNextState(currState, i);
                if (nextState != XMLContentModel::gInvalidTrans)
                    break;
            }
            else if ((type & 0x0f) == ContentSpecNode::Any_Other) {
                if (uri != elementURI && elementURI != fEmptyNamespaceId) {
                    nextState = cm->getNextState(currState, i);
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            }
            else if ((type & 0x0f) == ContentSpecNode::Any_NS) {
                if (uri == elementURI) {
                    nextState = cm->getNextState(currState, i);
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            }

        } // for

        if (i == leafCount) { // no match
            fElemState[parentElemDepth] = XMLContentModel::gInvalidTrans;
            fElemLoopState[parentElemDepth] = 0;
            return laxThisOne;
        }

        ContentSpecNode::NodeTypes type = cv->getLeafTypeAt(i);
        if ((type & 0x0f) == ContentSpecNode::Any ||
            (type & 0x0f) == ContentSpecNode::Any_Other ||
            (type & 0x0f) == ContentSpecNode::Any_NS)
        {
            if (type == ContentSpecNode::Any_Skip ||
                type == ContentSpecNode::Any_NS_Skip ||
                type == ContentSpecNode::Any_Other_Skip) {
                skipThisOne = true;
            }
            else if (type == ContentSpecNode::Any_Lax ||
                     type == ContentSpecNode::Any_NS_Lax ||
                     type == ContentSpecNode::Any_Other_Lax) {
                laxThisOne = true;
            }
        }
        fElemState[parentElemDepth] = nextState;
        fElemLoopState[parentElemDepth] = currLoop;
    } // if

    if (skipThisOne) {
        fValidate = false;
        fElemStack.setValidationFlag(fValidate);
    }

    return laxThisOne;
}